

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate-names.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_16::NameGenerator::BeginLoopExpr(NameGenerator *this,LoopExpr *expr)

{
  Index index;
  
  index = this->label_count_;
  this->label_count_ = index + 1;
  MaybeGenerateName("$L",index,&(expr->block).label);
  return (Result)Ok;
}

Assistant:

Result NameGenerator::BeginLoopExpr(LoopExpr* expr) {
  MaybeGenerateName("$L", label_count_++, &expr->block.label);
  return Result::Ok;
}